

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.cpp
# Opt level: O0

void __thiscall PseudoTopoOrder::RecalcTopoInverse(PseudoTopoOrder *this)

{
  size_type sVar1;
  reference pvVar2;
  PseudoTopoOrder *in_RDI;
  int i;
  int local_c;
  
  local_c = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->pto);
    if (sVar1 <= (ulong)(long)local_c) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->pto,(long)local_c);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->pto_inverse,(long)*pvVar2);
    *pvVar2 = local_c;
    local_c = local_c + 1;
  }
  AnnounceModification(in_RDI,0);
  return;
}

Assistant:

void PseudoTopoOrder::RecalcTopoInverse()
{
	for (int i = 0; i < pto.size(); ++i)
	{
		pto_inverse[pto[i]] = i;
	}

	AnnounceModification(0);
}